

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O0

void __thiscall CTcParser::add_export_to_list(CTcParser *this,CTcPrsExport *exp)

{
  CTcPrsExport *in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x1e0) == 0) {
    *(CTcPrsExport **)(in_RDI + 0x1d8) = in_RSI;
  }
  else {
    CTcPrsExport::set_next(*(CTcPrsExport **)(in_RDI + 0x1e0),in_RSI);
  }
  *(CTcPrsExport **)(in_RDI + 0x1e0) = in_RSI;
  return;
}

Assistant:

void CTcParser::add_export_to_list(CTcPrsExport *exp)
{
    /* link it at the end of our list */
    if (exp_tail_ == 0)
        exp_head_ = exp;
    else
        exp_tail_->set_next(exp);
    exp_tail_ = exp;
}